

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2EntityDecl(void *ctx,xmlChar *name,int type,xmlChar *publicId,xmlChar *systemId,
                      xmlChar *content)

{
  code *UNRECOVERED_JUMPTABLE;
  xmlEntityPtr pxVar1;
  xmlChar *pxVar2;
  
  if (ctx != (void *)0x0) {
    if (*(int *)((long)ctx + 0x150) == 2) {
      pxVar1 = xmlAddDtdEntity(*(xmlDocPtr *)((long)ctx + 0x10),name,type,publicId,systemId,content)
      ;
      if (pxVar1 == (xmlEntityPtr)0x0) {
        if (*(int *)((long)ctx + 0x1a4) == 0) {
          return;
        }
        if (*ctx == 0) {
          return;
        }
        UNRECOVERED_JUMPTABLE = *(code **)(*ctx + 0xa8);
        if (UNRECOVERED_JUMPTABLE == (code *)0x0) {
          return;
        }
        (*UNRECOVERED_JUMPTABLE)
                  (*(undefined8 *)((long)ctx + 8),
                   "Entity(%s) already defined in the external subset\n",name);
        return;
      }
    }
    else {
      if (*(int *)((long)ctx + 0x150) != 1) {
        xmlFatalErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_ENTITY_PROCESSING,
                       "SAX.xmlSAX2EntityDecl(%s) called while not in subset\n",name,systemId);
        return;
      }
      pxVar1 = xmlAddDocEntity(*(xmlDocPtr *)((long)ctx + 0x10),name,type,publicId,systemId,content)
      ;
      if (pxVar1 == (xmlEntityPtr)0x0) {
        if (*(int *)((long)ctx + 0x1a4) == 0) {
          return;
        }
        if ((*(int *)((long)ctx + 0x14c) != 0) && (*(int *)((long)ctx + 0x110) == -1)) {
          return;
        }
        *(undefined4 *)((long)ctx + 0x88) = 0x6b;
        __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctx,
                        (void *)0x0,1,0x6b,XML_ERR_WARNING,(char *)0x0,0,(char *)name,(char *)0x0,
                        (char *)0x0,0,0,"Entity(%s) already defined in the internal subset\n",name);
        return;
      }
    }
    if ((systemId != (xmlChar *)0x0) && (pxVar1->URI == (xmlChar *)0x0)) {
      if ((*(long *)((long)ctx + 0x38) == 0) ||
         (pxVar2 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8), pxVar2 == (xmlChar *)0x0)) {
        pxVar2 = *(xmlChar **)((long)ctx + 0x118);
      }
      pxVar2 = xmlBuildURI(systemId,pxVar2);
      pxVar1->URI = pxVar2;
    }
  }
  return;
}

Assistant:

void
xmlSAX2EntityDecl(void *ctx, const xmlChar *name, int type,
          const xmlChar *publicId, const xmlChar *systemId, xmlChar *content)
{
    xmlEntityPtr ent;
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    if (ctx == NULL) return;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2EntityDecl(%s, %d, %s, %s, %s)\n",
            name, type, publicId, systemId, content);
#endif
    if (ctxt->inSubset == 1) {
	ent = xmlAddDocEntity(ctxt->myDoc, name, type, publicId,
		              systemId, content);
	if ((ent == NULL) && (ctxt->pedantic))
	    xmlWarnMsg(ctxt, XML_WAR_ENTITY_REDEFINED,
	     "Entity(%s) already defined in the internal subset\n",
	               name);
	if ((ent != NULL) && (ent->URI == NULL) && (systemId != NULL)) {
	    xmlChar *URI;
	    const char *base = NULL;

	    if (ctxt->input != NULL)
		base = ctxt->input->filename;
	    if (base == NULL)
		base = ctxt->directory;

	    URI = xmlBuildURI(systemId, (const xmlChar *) base);
	    ent->URI = URI;
	}
    } else if (ctxt->inSubset == 2) {
	ent = xmlAddDtdEntity(ctxt->myDoc, name, type, publicId,
		              systemId, content);
	if ((ent == NULL) && (ctxt->pedantic) &&
	    (ctxt->sax != NULL) && (ctxt->sax->warning != NULL))
	    ctxt->sax->warning(ctxt->userData,
	     "Entity(%s) already defined in the external subset\n", name);
	if ((ent != NULL) && (ent->URI == NULL) && (systemId != NULL)) {
	    xmlChar *URI;
	    const char *base = NULL;

	    if (ctxt->input != NULL)
		base = ctxt->input->filename;
	    if (base == NULL)
		base = ctxt->directory;

	    URI = xmlBuildURI(systemId, (const xmlChar *) base);
	    ent->URI = URI;
	}
    } else {
	xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_PROCESSING,
	               "SAX.xmlSAX2EntityDecl(%s) called while not in subset\n",
		       name, NULL);
    }
}